

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O2

void __thiscall
cppcms::url_mapper::real_map
          (url_mapper *this,char *ckey,streamable **params,size_t params_no,ostream *output)

{
  char *pcVar1;
  data *pdVar2;
  url_mapper *puVar3;
  ulong uVar4;
  mapped_type *this_00;
  cppcms_error *this_01;
  uint uVar5;
  ulong uVar6;
  vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> direct;
  string_key key;
  map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mappings;
  string_key real_key;
  string local_2a8 [32];
  steal_buffer<128UL> temp_buf;
  ostringstream ss;
  
  util::steal_buffer<128UL>::steal_buffer(&temp_buf);
  if (((this->d).ptr_)->throws == false) {
    util::steal_buffer<128UL>::steal(&temp_buf,output);
  }
  key.end_ = ckey + -1;
  do {
    pcVar1 = key.end_ + 1;
    key.end_ = key.end_ + 1;
  } while (*pcVar1 != '\0');
  key.key_._M_dataplus._M_p = (pointer)&key.key_.field_2;
  key.key_._M_string_length = 0;
  real_key.key_._M_dataplus._M_p = (pointer)&real_key.key_.field_2;
  real_key.begin_ = (char *)0x0;
  real_key.end_ = (char *)0x0;
  real_key.key_._M_string_length = 0;
  key.key_.field_2._M_local_buf[0] = '\0';
  real_key.key_.field_2._M_local_buf[0] = '\0';
  direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  key.begin_ = ckey;
  puVar3 = get_mapper_for_key(this,&key,&real_key,&direct);
  uVar4 = ((long)direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x30;
  if (uVar4 <= params_no) {
    mappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &mappings._M_t._M_impl.super__Rb_tree_header._M_header;
    mappings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    mappings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    mappings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    mappings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         mappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        direct.super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pdVar2 = (puVar3->d).ptr_;
      puVar3 = topmost(this);
      data::map(pdVar2,&real_key,&key,params,params_no,&((puVar3->d).ptr_)->helpers,&mappings,output
               );
    }
    else {
      for (uVar5 = 0; uVar6 = (ulong)uVar5,
          uVar6 < (ulong)(((long)direct.
                                 super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)direct.
                                super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x30);
          uVar5 = uVar5 + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        std::ios::copyfmt((ios *)((ostringstream *)&ss + *(long *)(_ss + -0x18)));
        filters::streamable::operator()(params[uVar6],(ostream *)&ss);
        std::__cxx11::stringbuf::str();
        this_00 = std::
                  map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&mappings,
                               direct.
                               super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar6);
        std::__cxx11::string::operator=((string *)this_00,local_2a8);
        std::__cxx11::string::~string(local_2a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
      }
      pdVar2 = (puVar3->d).ptr_;
      puVar3 = topmost(this);
      data::map(pdVar2,&real_key,&key,params + uVar4,params_no - uVar4,&((puVar3->d).ptr_)->helpers,
                &mappings,output);
    }
    std::
    _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&mappings._M_t);
    std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::~vector(&direct);
    std::__cxx11::string::~string((string *)&real_key.key_);
    std::__cxx11::string::~string((string *)&key.key_);
    if (((this->d).ptr_)->throws == false) {
      util::steal_buffer<128UL>::release(&temp_buf);
      *(undefined1 *)temp_buf.super_stackbuf<128UL>._40_8_ = 0;
      std::operator<<(output,(char *)temp_buf.super_stackbuf<128UL>._32_8_);
    }
    util::steal_buffer<128UL>::~steal_buffer(&temp_buf);
    return;
  }
  this_01 = (cppcms_error *)
            __cxa_allocate_exception
                      (0x30,direct.
                            super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                       ((long)direct.
                              super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)direct.
                             super__Vector_base<cppcms::string_key,_std::allocator<cppcms::string_key>_>
                             ._M_impl.super__Vector_impl_data._M_start) % 0x30);
  std::__cxx11::string::string
            ((string *)&ss,
             "url_mapper: number of keywords is larger then number of actual parameters",
             (allocator *)&mappings);
  cppcms_error::cppcms_error(this_01,(string *)&ss);
  __cxa_throw(this_01,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void url_mapper::real_map(	char const *ckey,
					filters::streamable const * const *params,
					size_t params_no,
					std::ostream &output)
	{
		util::steal_buffer<> temp_buf;
		if(!d->throws)
			temp_buf.steal(output);
		try {
			string_key key=string_key::unowned(ckey);
			string_key real_key;
			std::vector<string_key> direct;
			url_mapper &mp = get_mapper_for_key(key,real_key,direct);
			if(params_no < direct.size())
				throw cppcms_error("url_mapper: number of keywords is larger then number of actual parameters");
			std::map<string_key,std::string> mappings;
			if(direct.size() == 0) {
				mp.d->map(real_key,key,params,params_no,topmost().d->helpers,mappings,output);
			}
			else {
				size_t direct_size = direct.size();
				filters::streamable const * const *key_params = params;
				params += direct_size;
				params_no -= direct_size;
				for(unsigned i=0;i<direct.size();i++) {
					std::ostringstream ss;
					ss.copyfmt(output);
					(*key_params[i])(ss);
					mappings[direct[i]]=ss.str();
				}
				mp.d->map(real_key,key,params,params_no,topmost().d->helpers,mappings,output);
			}
		}
		catch(cppcms_error const &e) {
			if(d->throws) {
				throw;
			}
			BOOSTER_ERROR("cppcms") << e.what() <<'\n' << booster::trace(e);
			temp_buf.release();
			output<<"/this_is_an_invalid_url_generated_by_url_mapper";
			return;
		}
		if(!d->throws) {
			temp_buf.release();
			output << temp_buf.c_str();
		}
	}